

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void quoteFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3_value *pVal;
  uint uVar1;
  uchar *puVar2;
  void *pvVar3;
  ulong uVar4;
  code *xDel;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  double dVar9;
  double r2;
  char zBuf [50];
  
  pVal = *argv;
  switch("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
         [pVal->flags & 0x3f]) {
  case '\x01':
    sqlite3_result_value(context,pVal);
    return;
  case '\x02':
    dVar9 = sqlite3VdbeRealValue(pVal);
    sqlite3_snprintf(0x32,zBuf,"%!.15g");
    sqlite3AtoF(zBuf,&r2,0x14,'\x01');
    if ((dVar9 != r2) || (NAN(dVar9) || NAN(r2))) {
      sqlite3_snprintf(0x32,zBuf,"%!.20e");
    }
    sqlite3_result_text(context,zBuf,-1,(_func_void_void_ptr *)0xffffffffffffffff);
    return;
  case '\x03':
    puVar2 = sqlite3_value_text(pVal);
    if (puVar2 == (uchar *)0x0) {
      return;
    }
    lVar8 = 3;
    lVar6 = 0;
    do {
      if (puVar2[lVar8 + -3] == '\'') {
        lVar6 = lVar6 + 1;
      }
      else if (puVar2[lVar8 + -3] == '\0') goto LAB_001aba55;
      lVar8 = lVar8 + 1;
    } while( true );
  case '\x04':
    pvVar3 = sqlite3_value_blob(pVal);
    uVar1 = sqlite3_value_bytes(*argv);
    pcVar7 = (char *)contextMalloc(context,(long)(int)uVar1 * 2 + 4);
    if (pcVar7 == (char *)0x0) {
      return;
    }
    uVar4 = 0;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = uVar4;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      pcVar7[uVar4 * 2 + 2] = "0123456789ABCDEF"[*(byte *)((long)pvVar3 + uVar4) >> 4];
      pcVar7[uVar4 * 2 + 3] = "0123456789ABCDEF"[*(byte *)((long)pvVar3 + uVar4) & 0xf];
    }
    (pcVar7 + (long)(int)uVar1 * 2 + 2)[0] = '\'';
    (pcVar7 + (long)(int)uVar1 * 2 + 2)[1] = '\0';
    pcVar7[0] = 'X';
    pcVar7[1] = '\'';
    sqlite3_result_text(context,pcVar7,-1,(_func_void_void_ptr *)0xffffffffffffffff);
    sqlite3_free(pcVar7);
    return;
  default:
    pcVar7 = "NULL";
    uVar5 = 4;
    xDel = (_func_void_void_ptr *)0x0;
  }
LAB_001abadd:
  sqlite3_result_text(context,pcVar7,(int)uVar5,xDel);
  return;
LAB_001aba55:
  pcVar7 = (char *)contextMalloc(context,lVar6 + lVar8);
  if (pcVar7 == (char *)0x0) {
    return;
  }
  *pcVar7 = '\'';
  uVar4 = 1;
  while( true ) {
    lVar8 = (long)(int)uVar4;
    uVar5 = lVar8 + 1;
    if (*puVar2 == '\0') break;
    pcVar7[lVar8] = *puVar2;
    if (*puVar2 == '\'') {
      pcVar7[uVar5] = '\'';
      uVar5 = (ulong)((int)uVar4 + 2);
    }
    puVar2 = puVar2 + 1;
    uVar4 = uVar5 & 0xffffffff;
  }
  pcVar7[lVar8] = '\'';
  pcVar7[uVar5] = '\0';
  xDel = sqlite3_free;
  goto LAB_001abadd;
}

Assistant:

static void quoteFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_FLOAT: {
      double r1, r2;
      char zBuf[50];
      r1 = sqlite3_value_double(argv[0]);
      sqlite3_snprintf(sizeof(zBuf), zBuf, "%!.15g", r1);
      sqlite3AtoF(zBuf, &r2, 20, SQLITE_UTF8);
      if( r1!=r2 ){
        sqlite3_snprintf(sizeof(zBuf), zBuf, "%!.20e", r1);
      }
      sqlite3_result_text(context, zBuf, -1, SQLITE_TRANSIENT);
      break;
    }
    case SQLITE_INTEGER: {
      sqlite3_result_value(context, argv[0]);
      break;
    }
    case SQLITE_BLOB: {
      char *zText = 0;
      char const *zBlob = sqlite3_value_blob(argv[0]);
      int nBlob = sqlite3_value_bytes(argv[0]);
      assert( zBlob==sqlite3_value_blob(argv[0]) ); /* No encoding change */
      zText = (char *)contextMalloc(context, (2*(i64)nBlob)+4); 
      if( zText ){
        int i;
        for(i=0; i<nBlob; i++){
          zText[(i*2)+2] = hexdigits[(zBlob[i]>>4)&0x0F];
          zText[(i*2)+3] = hexdigits[(zBlob[i])&0x0F];
        }
        zText[(nBlob*2)+2] = '\'';
        zText[(nBlob*2)+3] = '\0';
        zText[0] = 'X';
        zText[1] = '\'';
        sqlite3_result_text(context, zText, -1, SQLITE_TRANSIENT);
        sqlite3_free(zText);
      }
      break;
    }
    case SQLITE_TEXT: {
      int i,j;
      u64 n;
      const unsigned char *zArg = sqlite3_value_text(argv[0]);
      char *z;

      if( zArg==0 ) return;
      for(i=0, n=0; zArg[i]; i++){ if( zArg[i]=='\'' ) n++; }
      z = contextMalloc(context, ((i64)i)+((i64)n)+3);
      if( z ){
        z[0] = '\'';
        for(i=0, j=1; zArg[i]; i++){
          z[j++] = zArg[i];
          if( zArg[i]=='\'' ){
            z[j++] = '\'';
          }
        }
        z[j++] = '\'';
        z[j] = 0;
        sqlite3_result_text(context, z, j, sqlite3_free);
      }
      break;
    }
    default: {
      assert( sqlite3_value_type(argv[0])==SQLITE_NULL );
      sqlite3_result_text(context, "NULL", 4, SQLITE_STATIC);
      break;
    }
  }
}